

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O3

void __thiscall
Iir::RBJ::LowShelf::setupN(LowShelf *this,double cutoffFrequency,double gainDb,double shelfSlope)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  __x = pow(10.0,gainDb / 40.0);
  dVar1 = cos(cutoffFrequency * 6.283185307179586);
  dVar2 = sin(cutoffFrequency * 6.283185307179586);
  dVar3 = (1.0 / shelfSlope + -1.0) * (1.0 / __x + __x) + 2.0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if (__x < 0.0) {
    dVar4 = sqrt(__x);
  }
  else {
    dVar4 = SQRT(__x);
  }
  dVar6 = dVar2 * 0.5 * dVar3 * (dVar4 + dVar4);
  dVar2 = __x + 1.0;
  dVar5 = __x + -1.0;
  dVar4 = dVar2 - dVar5 * dVar1;
  dVar3 = dVar5 * dVar1 + dVar2;
  Biquad::setCoefficients
            ((Biquad *)this,dVar3 + dVar6,(dVar1 * dVar2 + dVar5) * -2.0,dVar3 - dVar6,
             (dVar4 + dVar6) * __x,(dVar5 - dVar1 * dVar2) * (__x + __x),(dVar4 - dVar6) * __x);
  return;
}

Assistant:

void LowShelf::setupN (double cutoffFrequency,
			      double gainDb,
			      double shelfSlope)
	{
		double A  = pow (10, gainDb/40);
		double w0 = 2 * doublePi * cutoffFrequency;
		double cs = cos (w0);
		double sn = sin (w0);
		double AL = sn / 2 * ::std::sqrt ((A + 1/A) * (1/shelfSlope - 1) + 2);
		double sq = 2 * sqrt(A) * AL;
		double b0 =    A*( (A+1) - (A-1)*cs + sq );
		double b1 =  2*A*( (A-1) - (A+1)*cs );
		double b2 =    A*( (A+1) - (A-1)*cs - sq );
		double a0 =        (A+1) + (A-1)*cs + sq;
		double a1 =   -2*( (A-1) + (A+1)*cs );
		double a2 =        (A+1) + (A-1)*cs - sq;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}